

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_resampler_internal.h
# Opt level: O2

void __thiscall
passthrough_resampler<short>::drop_audio_if_needed(passthrough_resampler<short> *this)

{
  cubeb_log_level cVar1;
  cubeb_log_callback p_Var2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  uVar3 = this->sample_rate / 0x14;
  uVar5 = (uint)((this->internal_input_buffer).length_ / (ulong)(this->super_processor).channels);
  uVar4 = uVar5 - uVar3;
  if (uVar3 <= uVar5 && uVar4 != 0) {
    cVar1 = cubeb_log_get_level();
    if (1 < (int)cVar1) {
      p_Var2 = cubeb_log_get_callback();
      if (p_Var2 != (cubeb_log_callback)0x0) {
        cubeb_async_log("Dropping %u frames");
      }
    }
    auto_array<short>::pop
              (&this->internal_input_buffer,(short *)0x0,
               (ulong)(this->super_processor).channels * (ulong)uVar4);
    return;
  }
  return;
}

Assistant:

void drop_audio_if_needed()
  {
    uint32_t to_keep = min_buffered_audio_frame(sample_rate);
    uint32_t available = samples_to_frames(internal_input_buffer.length());
    if (available > to_keep) {
      ALOGV("Dropping %u frames", available - to_keep);
      internal_input_buffer.pop(nullptr,
                                frames_to_samples(available - to_keep));
    }
  }